

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O1

int doprring(void)

{
  undefined8 in_RAX;
  uint uVar1;
  ulong uVar2;
  char lets [3];
  undefined8 uStack_8;
  
  if (uleft == (obj *)0x0 && uright == (obj *)0x0) {
    pline("You are not wearing any rings.");
  }
  else {
    uStack_8 = in_RAX;
    if (uleft != (obj *)0x0) {
      uStack_8._6_2_ = (undefined2)((ulong)in_RAX >> 0x30);
      uStack_8._0_6_ = CONCAT15(uleft->invlet,(int5)in_RAX);
    }
    uVar1 = (uint)(uleft != (obj *)0x0);
    if (uright != (obj *)0x0) {
      uVar2 = (ulong)uVar1;
      uVar1 = uVar1 + 1;
      *(char *)((long)&uStack_8 + uVar2 + 5) = uright->invlet;
    }
    *(undefined1 *)((long)&uStack_8 + (ulong)uVar1 + 5) = 0;
    display_pickinv((char *)((long)&uStack_8 + 5),'\0',(long *)0x0);
  }
  return 0;
}

Assistant:

int doprring(void)
{
	if (!uleft && !uright)
		pline("You are not wearing any rings.");
	else {
		char lets[3];
		int ct = 0;

		if (uleft) lets[ct++] = obj_to_let(uleft);
		if (uright) lets[ct++] = obj_to_let(uright);
		lets[ct] = 0;
		display_inventory(lets, FALSE);
	}
	return 0;
}